

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

string * __thiscall
argvParser::generateMarkdownArgumentOverview_abi_cxx11_
          (string *__return_storage_ptr__,argvParser *this)

{
  value_type paVar1;
  bool bVar2;
  reference ppsVar3;
  reference ppaVar4;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar5;
  int x;
  ulong uVar6;
  int i;
  ulong uVar7;
  string req;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_70);
  std::operator+(&local_b0,"# ",&(this->super_argParserAdvancedConfiguration).applicationName);
  std::operator+(&local_70,&local_b0,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string
            ((string *)&local_70,"## Required arguments: \n",(allocator *)&local_b0);
  bVar2 = false;
  for (uVar7 = 0; pvVar5 = (this->super_argParserAdvancedConfiguration).newargconfig,
      uVar7 < (ulong)((long)(pvVar5->
                            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar5->
                            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    uVar6 = 0;
    while( true ) {
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(pvVar5,uVar7);
      if ((ulong)((long)((*ppsVar3)->arguments->
                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)((*ppsVar3)->arguments->
                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) break;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at((this->super_argParserAdvancedConfiguration).newargconfig,uVar7);
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar3)->arguments,uVar6);
      paVar1 = *ppaVar4;
      if (paVar1->requiredAndNotHitJet == true) {
        if (!bVar2) {
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        std::operator+(&local_90," * ",&paVar1->argLong);
        std::operator+(&local_b0,&local_90,"\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        bVar2 = true;
      }
      uVar6 = uVar6 + 1;
      pvVar5 = (this->super_argParserAdvancedConfiguration).newargconfig;
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (uVar7 = 0; pvVar5 = (this->super_argParserAdvancedConfiguration).newargconfig,
      uVar7 < (ulong)((long)(pvVar5->
                            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar5->
                            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    ppsVar3 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::at(pvVar5,uVar7);
    if (((*ppsVar3)->sectionName)._M_string_length != 0) {
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at((this->super_argParserAdvancedConfiguration).newargconfig,uVar7);
      std::operator+(&local_90,"### ",&(*ppsVar3)->sectionName);
      std::operator+(&local_b0,&local_90,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    uVar6 = 0;
    while( true ) {
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at((this->super_argParserAdvancedConfiguration).newargconfig,uVar7);
      if ((ulong)((long)((*ppsVar3)->arguments->
                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)((*ppsVar3)->arguments->
                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) break;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at((this->super_argParserAdvancedConfiguration).newargconfig,uVar7);
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar3)->arguments,uVar6);
      paVar1 = *ppaVar4;
      std::operator+(&local_90,"#### ",&paVar1->argLong);
      std::operator+(&local_b0,&local_90,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::operator+(&local_b0,&paVar1->helpMessage,"\n\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&local_b0,&paVar1->additionalHelp,"\n\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&local_90,"    short: ",&paVar1->argShort);
      std::operator+(&local_b0,&local_90," \n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::operator+(&local_90,"    long : ",&paVar1->argLong);
      std::operator+(&local_b0,&local_90," \n\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      if (0 < paVar1->numberOfArguments) {
        std::__cxx11::to_string(&local_50,paVar1->numberOfArguments);
        std::operator+(&local_90,"number of additional parameter: ",&local_50);
        std::operator+(&local_b0,&local_90," \n \n ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
      }
      bVar2 = std::operator!=(&paVar1->enums,"");
      if (bVar2) {
        std::operator+(&local_90,"allowed parameter: ",&paVar1->enums);
        std::operator+(&local_b0,&local_90,"\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      if (paVar1->requiredAndNotHitJet == true) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar6 = uVar6 + 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string argvParser::generateMarkdownArgumentOverview() {

  string md = "";

  md += "# "+ applicationName + "\n";
    string req =  "## Required arguments: \n";
    bool hasReq = false;

  for(int i = 0; i< newargconfig->size();i++) {
      for(int x = 0; x< newargconfig->at(i)->arguments->size();x++) {
          argument * arg = newargconfig->at(i)->arguments->at(x);
          if(arg->requiredAndNotHitJet){
              if(!hasReq){
                  hasReq = true;
                  md += req;
              }
              md += " * " +  arg->argLong + "\n";
          }
    }
  }
  md+= "## Application Arguments \n";
      for(int i = 0; i< newargconfig->size();i++) {
          if (!newargconfig->at(i)->sectionName.empty()) {
              md += "### " + newargconfig->at(i)->sectionName + "\n";
          }
          for (int x = 0; x < newargconfig->at(i)->arguments->size(); x++) {
              argument *arg = newargconfig->at(i)->arguments->at(x);
              md += "#### " + arg->argLong + "\n";
              md += arg->helpMessage + "\n\n";
              md += arg->additionalHelp + "\n\n";
              md += "    short: " + arg->argShort + " \n";
              md += "    long : " + arg->argLong + " \n\n";
              if (arg->numberOfArguments > 0)
                  md += "number of additional parameter: " + to_string(arg->numberOfArguments) + " \n \n ";
              if (arg->enums != "") {
                  md += "allowed parameter: " + arg->enums + "\n";
              }
              if (arg->requiredAndNotHitJet) {
                  md += "This argument is requires \n";
              }

          }
      }
    return md;
}